

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O0

int ncnn::convolutiondepthwise
              (Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
              int kernel_h,int stride_w,int stride_h,int dilation_w,int dilation_h,int group,
              int activation_type,Mat *activation_params,Option *opt)

{
  float *pfVar1;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  float fVar2;
  float fVar3;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  undefined4 in_stack_00000030;
  long *in_stack_00000038;
  float w_2;
  float val_1;
  int k_1;
  float *sptr_1;
  Mat m_4;
  int q;
  float *kptr_1;
  float sum_1;
  int j_2;
  int i_2;
  int outh_1;
  int outw_1;
  float *weight_data_ptr;
  float *outptr_1;
  int p;
  int g_1;
  int outch_g;
  int inch_g;
  float w_1;
  float val;
  int k;
  float *sptr;
  float sum;
  int j_1;
  int i_1;
  Mat m;
  float *kptr;
  float *outptr;
  int g;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int bias_term;
  int outch;
  int outh;
  int outw;
  int inch;
  int w;
  Mat *m_3;
  Mat *m_1;
  float upper_1;
  float lower_1;
  float beta_1;
  float alpha_1;
  float max_1;
  float min_1;
  float slope_1;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  Mat *m_5;
  Mat *m_2;
  float local_7cc;
  allocator_type *in_stack_fffffffffffff840;
  size_type in_stack_fffffffffffff848;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff850;
  float local_74c;
  bool local_6cd;
  int local_6c4;
  undefined8 local_6b8;
  undefined8 local_6b0;
  undefined8 local_6a8;
  undefined4 local_6a0;
  long local_698;
  undefined4 local_690;
  undefined4 local_68c;
  undefined4 local_688;
  undefined4 local_684;
  undefined4 local_680;
  undefined8 local_678;
  int local_66c;
  long local_668;
  float local_65c;
  int local_658;
  int local_654;
  int local_650;
  int local_64c;
  long local_648;
  undefined8 local_640;
  undefined8 local_638;
  undefined8 local_630;
  undefined4 local_628;
  long local_620;
  undefined4 local_618;
  undefined4 local_614;
  undefined4 local_610;
  undefined4 local_60c;
  undefined4 local_608;
  undefined8 local_600;
  long local_5f8;
  int local_5ec;
  int local_5e8;
  int local_5e4;
  int local_5e0;
  float local_5dc;
  float local_5d8;
  int local_5d4;
  long local_5d0;
  float local_5c4;
  int local_5c0;
  int local_5bc;
  void *local_5b8;
  int *local_5b0;
  ulong local_5a8;
  undefined4 local_5a0;
  long *local_598;
  int local_590;
  int local_58c;
  int local_588;
  undefined4 local_584;
  undefined4 local_580;
  ulong local_578;
  long local_570;
  undefined8 local_568;
  undefined8 local_560;
  undefined8 local_558;
  undefined4 local_550;
  long local_548;
  undefined4 local_540;
  undefined4 local_53c;
  undefined4 local_538;
  undefined4 local_534;
  undefined4 local_530;
  undefined8 local_528;
  long local_520;
  int local_518;
  int local_514;
  int local_510;
  int local_50c;
  int local_508;
  int local_504;
  reference local_500;
  vector<int,_std::allocator<int>_> local_4e0;
  int local_4c4;
  uint local_4c0;
  int local_4bc;
  int local_4b8;
  int local_4b4;
  int local_4b0;
  int local_4ac;
  int local_4a8;
  int local_4a4;
  long *local_4a0;
  long *local_498;
  long *local_490;
  long *local_488;
  undefined8 *local_480;
  void **local_470;
  undefined8 *local_460;
  allocator_type *local_450;
  undefined8 *local_438;
  undefined8 *local_430;
  long local_428;
  long *local_420;
  long local_418;
  long *local_410;
  undefined1 local_405;
  int local_404;
  undefined8 *local_3f8;
  undefined1 local_3e5;
  int local_3e4;
  undefined8 *local_3d8;
  float local_3c4;
  float local_3c0;
  float local_3bc;
  float local_3b8;
  float local_3b4;
  float local_3b0;
  float local_3ac;
  float local_3a8;
  float local_3a4;
  long *local_3a0;
  float local_394 [3];
  long *local_388;
  undefined8 local_380;
  long *local_378;
  undefined8 local_370;
  long *local_368;
  undefined8 local_360;
  long *local_358;
  undefined8 local_350;
  long *local_348;
  float local_33c;
  float local_338;
  float local_334;
  float local_330;
  float local_32c;
  float local_328;
  float local_324;
  float local_320;
  float local_31c;
  long *local_318;
  float local_30c [3];
  long *local_300;
  undefined8 local_2f8;
  long *local_2f0;
  undefined8 local_2e8;
  long *local_2e0;
  undefined8 local_2d8;
  long *local_2d0;
  undefined8 local_2c8;
  long *local_2c0;
  allocator_type *local_280;
  undefined8 *local_260;
  int local_248;
  undefined4 local_244;
  void **local_240;
  undefined8 *local_220;
  void *local_208;
  long *local_1c0;
  undefined1 local_1ad;
  int local_1ac;
  undefined8 *local_1a0;
  undefined1 local_175;
  int local_174;
  void **local_168;
  int local_13c;
  undefined8 *local_138;
  int local_12c;
  void **local_128;
  long *local_120;
  undefined4 local_114;
  ulong local_110;
  void *local_108;
  undefined4 local_fc;
  int local_f8;
  int local_f4;
  void **local_f0;
  long local_e8;
  undefined4 local_dc;
  long local_d8;
  long local_d0;
  undefined4 local_c4;
  int local_c0;
  int local_bc;
  undefined8 *local_b8;
  long local_b0;
  undefined4 local_a4;
  long local_a0;
  long local_98;
  undefined4 local_8c;
  int local_88;
  int local_84;
  undefined8 *local_80;
  long local_78;
  undefined4 local_6c;
  long local_68;
  long local_60;
  undefined4 local_54;
  int local_50;
  int local_4c;
  undefined8 *local_48;
  undefined4 local_3c;
  long local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_4ac = *(int *)((long)in_RDI + 0x2c);
  local_4b0 = (int)in_RDI[7];
  local_4b4 = *(int *)((long)in_RSI + 0x2c);
  local_4b8 = (int)in_RSI[6];
  local_4bc = (int)in_RSI[7];
  local_6cd = true;
  if (*in_RCX != 0) {
    local_6cd = in_RCX[8] * (long)(int)in_RCX[7] == 0;
  }
  local_4c0 = (byte)~local_6cd & 1;
  local_4c4 = in_R8D * in_R9D;
  local_4a8 = in_R9D;
  local_4a4 = in_R8D;
  local_4a0 = in_RCX;
  local_498 = in_RDX;
  local_490 = in_RSI;
  local_488 = in_RDI;
  std::allocator<int>::allocator((allocator<int> *)0x13ee87f);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffff850,in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  std::allocator<int>::~allocator((allocator<int> *)0x13ee8ab);
  local_500 = std::vector<int,_std::allocator<int>_>::operator[](&local_4e0,0);
  local_504 = 0;
  local_508 = 0;
  local_50c = local_4ac * in_stack_00000020 - local_4a4 * in_stack_00000018;
  for (local_510 = 0; local_510 < local_4a8; local_510 = local_510 + 1) {
    for (local_514 = 0; local_514 < local_4a4; local_514 = local_514 + 1) {
      local_500[local_504] = local_508;
      local_504 = local_504 + 1;
      local_508 = in_stack_00000018 + local_508;
    }
    local_508 = local_50c + local_508;
  }
  if ((local_4b0 == in_stack_00000028) && (in_stack_00000028 == local_4bc)) {
    for (local_518 = 0; local_518 < in_stack_00000028; local_518 = local_518 + 1) {
      local_3d8 = &local_568;
      local_84 = *(int *)((long)local_490 + 0x2c);
      local_88 = (int)local_490[6];
      local_8c = *(undefined4 *)((long)local_490 + 0x34);
      local_520 = *local_490 + local_490[8] * (long)local_518 * local_490[2];
      local_a0 = local_490[2];
      local_a4 = (undefined4)local_490[3];
      local_b0 = local_490[4];
      local_80 = &local_568;
      local_28 = (long)local_84 * (long)local_88 * local_a0;
      local_430 = &local_568;
      local_480 = &local_568;
      local_2c = 0x10;
      local_3e4 = local_518;
      local_3e5 = 1;
      local_568 = 0;
      local_558 = 0;
      local_550 = 0;
      local_53c = 0;
      local_538 = 0;
      local_534 = 0;
      local_530 = 0;
      local_560 = 0;
      local_570 = *local_498 + (long)(local_4c4 * local_518) * 4;
      local_168 = &local_5b8;
      local_f4 = *(int *)((long)local_488 + 0x2c);
      local_f8 = (int)local_488[6];
      local_fc = *(undefined4 *)((long)local_488 + 0x34);
      local_108 = (void *)(*local_488 + local_488[8] * (long)local_518 * local_488[2]);
      local_110 = local_488[2];
      local_114 = (undefined4)local_488[3];
      local_120 = (long *)local_488[4];
      local_f0 = &local_5b8;
      local_5b0 = (int *)0x0;
      local_584 = 1;
      local_8 = (long)local_f4 * (long)local_f8 * local_110;
      local_578 = (local_8 + 0xfU & 0xfffffffffffffff0) / local_110;
      local_590 = (int)local_488[5] + -1;
      if ((int)local_488[5] == 4) {
        local_578 = (long)*(int *)((long)local_488 + 0x2c) * (long)(int)local_488[6];
      }
      local_c = 0x10;
      local_174 = local_518;
      local_175 = 1;
      local_528 = 0;
      local_540 = 0;
      local_220 = local_480;
      local_98 = local_520;
      local_5b8 = local_108;
      local_5a8 = local_110;
      local_5a0 = local_114;
      local_598 = local_120;
      local_58c = local_f4;
      local_588 = local_f8;
      local_580 = local_fc;
      local_548 = local_b0;
      for (local_5bc = 0; local_5bc < local_4b8; local_5bc = local_5bc + 1) {
        for (local_5c0 = 0; local_5c0 < local_4b4; local_5c0 = local_5c0 + 1) {
          local_5c4 = 0.0;
          if (local_4c0 != 0) {
            local_418 = (long)local_518;
            local_410 = local_4a0;
            local_5c4 = *(float *)(*local_4a0 + local_418 * 4);
          }
          local_12c = local_5bc * in_stack_00000010;
          local_128 = &local_5b8;
          local_5d0 = (long)local_5b8 +
                      (long)(local_5c0 * in_stack_00000008) * 4 +
                      (long)local_58c * (long)local_12c * local_5a8;
          for (local_5d4 = 0; fVar2 = local_5c4, local_5d4 < local_4c4; local_5d4 = local_5d4 + 1) {
            local_5d8 = *(float *)(local_5d0 + (long)local_500[local_5d4] * 4);
            local_5dc = *(float *)(local_570 + (long)local_5d4 * 4);
            local_5c4 = local_5d8 * local_5dc + local_5c4;
          }
          local_30c[0] = local_5c4;
          local_318 = in_stack_00000038;
          switch(in_stack_00000030) {
          case 1:
            if (local_5c4 <= 0.0) {
              local_30c[0] = 0.0;
            }
            break;
          case 2:
            local_2c0 = in_stack_00000038;
            local_2c8 = 0;
            local_31c = *(float *)*in_stack_00000038;
            if (local_5c4 <= 0.0) {
              local_74c = local_5c4 * local_31c;
            }
            else {
              local_74c = local_5c4;
            }
            local_30c[0] = local_74c;
            break;
          case 3:
            local_2d0 = in_stack_00000038;
            local_2d8 = 0;
            local_320 = *(float *)*in_stack_00000038;
            local_2e0 = in_stack_00000038;
            local_2e8 = 1;
            local_324 = *(float *)(*in_stack_00000038 + 4);
            if (local_5c4 < local_320) {
              local_30c[0] = local_320;
            }
            if (local_324 < local_30c[0]) {
              local_30c[0] = local_324;
            }
            break;
          case 4:
            local_328 = 88.37626;
            pfVar1 = std::min<float>(local_30c,&local_328);
            local_30c[0] = *pfVar1;
            local_32c = -88.37626;
            pfVar1 = std::max<float>(local_30c,&local_32c);
            local_30c[0] = *pfVar1;
            fVar2 = expf(-local_30c[0]);
            local_30c[0] = 1.0 / (fVar2 + 1.0);
            break;
          case 5:
            fVar3 = expf(local_5c4);
            fVar3 = logf(fVar3 + 1.0);
            local_30c[0] = tanhf(fVar3);
            local_30c[0] = fVar2 * local_30c[0];
            break;
          case 6:
            local_2f0 = in_stack_00000038;
            local_2f8 = 0;
            local_330 = *(float *)*in_stack_00000038;
            local_300 = in_stack_00000038;
            local_30c[1] = 1.4013e-45;
            local_30c[2] = 0.0;
            local_334 = *(float *)(*in_stack_00000038 + 4);
            local_338 = -local_334 / local_330;
            local_33c = 1.0 / local_330 + local_338;
            if (local_338 <= local_5c4) {
              if (local_5c4 <= local_33c) {
                local_30c[0] = local_5c4 * (local_5c4 * local_330 + local_334);
              }
            }
            else {
              local_30c[0] = 0.0;
            }
          }
          *(float *)(local_520 + (long)local_5c0 * 4) = local_30c[0];
        }
        local_520 = local_520 + (long)local_4b4 * 4;
      }
      local_470 = &local_5b8;
      local_240 = local_470;
      if (local_5b0 != (int *)0x0) {
        local_244 = 0xffffffff;
        LOCK();
        local_248 = *local_5b0;
        *local_5b0 = *local_5b0 + -1;
        UNLOCK();
        if (local_248 == 1) {
          if (local_598 == (long *)0x0) {
            local_208 = local_5b8;
            if (local_5b8 != (void *)0x0) {
              free(local_5b8);
            }
          }
          else {
            (**(code **)(*local_598 + 0x18))(local_598,local_5b8);
          }
        }
      }
      local_5b8 = (void *)0x0;
      local_5a8 = 0;
      local_5a0 = 0;
      local_590 = 0;
      local_58c = 0;
      local_588 = 0;
      local_584 = 0;
      local_580 = 0;
      local_578 = 0;
      local_5b0 = (int *)0x0;
    }
  }
  else {
    local_5e0 = local_4b0 / in_stack_00000028;
    local_5e4 = local_4bc / in_stack_00000028;
    for (local_5e8 = 0; local_5e8 < in_stack_00000028; local_5e8 = local_5e8 + 1) {
      for (local_5ec = 0; local_5ec < local_5e4; local_5ec = local_5ec + 1) {
        local_404 = local_5e8 * local_5e4 + local_5ec;
        local_3f8 = &local_640;
        local_4c = *(int *)((long)local_490 + 0x2c);
        local_50 = (int)local_490[6];
        local_54 = *(undefined4 *)((long)local_490 + 0x34);
        local_5f8 = *local_490 + local_490[8] * (long)local_404 * local_490[2];
        local_68 = local_490[2];
        local_6c = (undefined4)local_490[3];
        local_78 = local_490[4];
        local_48 = &local_640;
        local_38 = (long)local_4c * (long)local_50 * local_68;
        local_438 = &local_640;
        local_460 = &local_640;
        local_3c = 0x10;
        local_405 = 1;
        local_640 = 0;
        local_630 = 0;
        local_628 = 0;
        local_618 = 0;
        local_614 = 0;
        local_610 = 0;
        local_60c = 0;
        local_608 = 0;
        local_600 = 0;
        local_638 = 0;
        local_1c0 = local_498;
        local_648 = *local_498 + (long)(local_4c4 * local_5e0 * local_5e4 * local_5e8) * 4;
        local_64c = *(int *)((long)local_490 + 0x2c);
        local_650 = (int)local_490[6];
        local_260 = local_460;
        local_60 = local_5f8;
        local_620 = local_78;
        for (local_654 = 0; local_654 < local_650; local_654 = local_654 + 1) {
          for (local_658 = 0; local_658 < local_64c; local_658 = local_658 + 1) {
            local_65c = 0.0;
            if (local_4c0 != 0) {
              local_428 = (long)(local_5e4 * local_5e8 + local_5ec);
              local_420 = local_4a0;
              local_65c = *(float *)(*local_4a0 + local_428 * 4);
            }
            local_668 = local_648 + (long)(local_4c4 * local_5e0 * local_5ec) * 4;
            for (local_66c = 0; fVar2 = local_65c, local_66c < local_5e0; local_66c = local_66c + 1)
            {
              local_1ac = local_5e0 * local_5e8 + local_66c;
              local_1a0 = &local_6b8;
              local_bc = *(int *)((long)local_488 + 0x2c);
              local_c0 = (int)local_488[6];
              local_c4 = *(undefined4 *)((long)local_488 + 0x34);
              local_d0 = *local_488 + local_488[8] * (long)local_1ac * local_488[2];
              local_d8 = local_488[2];
              local_dc = (undefined4)local_488[3];
              local_e8 = local_488[4];
              local_b8 = &local_6b8;
              local_18 = (long)local_bc * (long)local_c0 * local_d8;
              local_13c = local_654 * in_stack_00000010;
              local_138 = &local_6b8;
              for (local_6c4 = 0; local_6c4 < local_4c4; local_6c4 = local_6c4 + 1) {
                local_65c = *(float *)(local_d0 + (long)local_bc * (long)local_13c * local_d8 +
                                       (long)(local_658 * in_stack_00000008) * 4 +
                                      (long)local_500[local_6c4] * 4) *
                            *(float *)(local_668 + (long)local_6c4 * 4) + local_65c;
              }
              local_668 = local_668 + (long)local_4c4 * 4;
              in_stack_fffffffffffff840 = (allocator_type *)&local_6b8;
              local_1c = 0x10;
              local_1ad = 1;
              local_6b8 = 0;
              local_6a8 = 0;
              local_6a0 = 0;
              local_690 = 0;
              local_68c = 0;
              local_688 = 0;
              local_684 = 0;
              local_680 = 0;
              local_678 = 0;
              local_6b0 = 0;
              local_450 = in_stack_fffffffffffff840;
              local_280 = in_stack_fffffffffffff840;
              local_698 = local_e8;
            }
            local_394[0] = local_65c;
            local_3a0 = in_stack_00000038;
            switch(in_stack_00000030) {
            case 1:
              if (local_65c <= 0.0) {
                local_394[0] = 0.0;
              }
              break;
            case 2:
              local_348 = in_stack_00000038;
              local_350 = 0;
              local_3a4 = *(float *)*in_stack_00000038;
              if (local_65c <= 0.0) {
                local_7cc = local_65c * local_3a4;
              }
              else {
                local_7cc = local_65c;
              }
              local_394[0] = local_7cc;
              break;
            case 3:
              local_358 = in_stack_00000038;
              local_360 = 0;
              local_3a8 = *(float *)*in_stack_00000038;
              local_368 = in_stack_00000038;
              local_370 = 1;
              local_3ac = *(float *)(*in_stack_00000038 + 4);
              if (local_65c < local_3a8) {
                local_394[0] = local_3a8;
              }
              if (local_3ac < local_394[0]) {
                local_394[0] = local_3ac;
              }
              break;
            case 4:
              local_3b0 = 88.37626;
              pfVar1 = std::min<float>(local_394,&local_3b0);
              local_394[0] = *pfVar1;
              local_3b4 = -88.37626;
              pfVar1 = std::max<float>(local_394,&local_3b4);
              local_394[0] = *pfVar1;
              fVar2 = expf(-local_394[0]);
              local_394[0] = 1.0 / (fVar2 + 1.0);
              break;
            case 5:
              fVar3 = expf(local_65c);
              fVar3 = logf(fVar3 + 1.0);
              local_394[0] = tanhf(fVar3);
              local_394[0] = fVar2 * local_394[0];
              break;
            case 6:
              local_378 = in_stack_00000038;
              local_380 = 0;
              local_3b8 = *(float *)*in_stack_00000038;
              local_388 = in_stack_00000038;
              local_394[1] = 1.4013e-45;
              local_394[2] = 0.0;
              local_3bc = *(float *)(*in_stack_00000038 + 4);
              local_3c0 = -local_3bc / local_3b8;
              local_3c4 = 1.0 / local_3b8 + local_3c0;
              if (local_3c0 <= local_65c) {
                if (local_65c <= local_3c4) {
                  local_394[0] = local_65c * (local_65c * local_3b8 + local_3bc);
                }
              }
              else {
                local_394[0] = 0.0;
              }
            }
            *(float *)(local_5f8 + (long)local_658 * 4) = local_394[0];
          }
          local_5f8 = local_5f8 + (long)local_64c * 4;
        }
      }
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff840);
  return 0;
}

Assistant:

static int convolutiondepthwise(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int kernel_h, int stride_w, int stride_h, int dilation_w, int dilation_h, int group, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int w = bottom_blob.w;
    const int inch = bottom_blob.c;

    const int outw = top_blob.w;
    const int outh = top_blob.h;
    const int outch = top_blob.c;

    const int bias_term = bias_data.empty() ? 0 : 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // depth-wise
    if (inch == group && group == outch)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            float* outptr = top_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            const Mat m = bottom_blob.channel(g);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[g];

                    const float* sptr = m.row(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        float w = kptr[k];
                        sum += val * w;
                    }

                    outptr[j] = activation_ss(sum, activation_type, activation_params);
                }

                outptr += outw;
            }
        }
    }
    else
    {
        // group convolution
        const int inch_g = inch / group;
        const int outch_g = outch / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < outch_g; p++)
            {
                float* outptr = top_blob.channel(g * outch_g + p);
                const float* weight_data_ptr = (const float*)weight_data + maxk * inch_g * outch_g * g;

                // shadowed variable for less openmp task args
                const int outw = top_blob.w;
                const int outh = top_blob.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                            sum = bias_data[outch_g * g + p];

                        const float* kptr = weight_data_ptr + maxk * inch_g * p;

                        for (int q = 0; q < inch_g; q++)
                        {
                            const Mat m = bottom_blob.channel(inch_g * g + q);
                            const float* sptr = m.row(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                float val = sptr[space_ofs[k]];
                                float w = kptr[k];
                                sum += val * w;
                            }

                            kptr += maxk;
                        }

                        outptr[j] = activation_ss(sum, activation_type, activation_params);
                    }

                    outptr += outw;
                }
            }
        }
    }

    return 0;
}